

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSocketCommon.cpp
# Opt level: O0

ssize_t PosixSocketCommon::read(int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  sockaddr *in_RCX;
  double in_XMM0_Qa;
  int ret;
  socklen_t local_2c;
  uint local_4;
  
  bVar1 = isBlockingEnabled(0);
  if (((!bVar1) || (in_XMM0_Qa <= 0.0)) ||
     (iVar2 = doBlockingTimeout((int)((ulong)in_XMM0_Qa >> 0x20),(short)((ulong)in_XMM0_Qa >> 0x10),
                                (double)in_RCX), iVar2 != 0)) {
    sVar3 = recvfrom(__fd,__buf,__nbytes & 0xffffffff,0,in_RCX,&local_2c);
    local_4 = (uint)sVar3;
  }
  else {
    local_4 = 0;
  }
  return (ulong)local_4;
}

Assistant:

int PosixSocketCommon::read(int          socket_fd,
                            char*        buffer,
                            unsigned int size,
                            double       class_ts_bt,
                            sockaddr*    class_rfa,
                            socklen_t    class_rfa_size)
{
    // Is a valid timeout set?
    if (isBlockingEnabled(socket_fd) && class_ts_bt > 0.0)
    {
        // Perform the blocking timeout and check if the POLLIN event occurred
        if (doBlockingTimeout(socket_fd, POLLIN, class_ts_bt) == 0)
        {
            // No data is ready to read, just return
            return 0;
        }
    }

    // Read data
    int ret = recvfrom(socket_fd, buffer, size, 0, class_rfa, &class_rfa_size);

#if defined DEBUG
    if (ret == -1)
    {
        perror("PosixSocketCommon::read");
    }
#endif

    return ret;
}